

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestInt value)

{
  bool bVar1;
  byte *pbVar2;
  byte *__s;
  Json *pJVar3;
  UIntToStringBuffer buffer;
  allocator<char> local_29;
  byte local_28 [22];
  byte local_12 [10];
  
  pJVar3 = (Json *)-(long)this;
  if (0 < (long)this) {
    pJVar3 = this;
  }
  local_12[2] = 0;
  pbVar2 = local_12 + 1;
  do {
    __s = pbVar2;
    *__s = (char)pJVar3 + (char)(Json *)((ulong)pJVar3 / 10) * -10 | 0x30;
    pbVar2 = __s + -1;
    bVar1 = (Json *)0x9 < pJVar3;
    pJVar3 = (Json *)((ulong)pJVar3 / 10);
  } while (bVar1);
  if ((long)this < 0) {
    *pbVar2 = 0x2d;
    __s = pbVar2;
  }
  if (__s < local_28) {
    __assert_fail("current >= buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_writer.cpp"
                  ,0x2c,"std::string Json::valueToString(LargestInt)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)__s,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString( LargestInt value )
{
   UIntToStringBuffer buffer;
   char *current = buffer + sizeof(buffer);
   bool isNegative = value < 0;
   if ( isNegative )
      value = -value;
   uintToString( LargestUInt(value), current );
   if ( isNegative )
      *--current = '-';
   assert( current >= buffer );
   return current;
}